

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

bool google::protobuf::internal::InitProtobufDefaultsImpl(void)

{
  undefined1 in_AL;
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  fixed_address_empty_string = &DAT_00592ee0;
  DAT_00592ed8 = 0;
  DAT_00592ee0 = 0;
  OnShutdownRun(DestroyString,&fixed_address_empty_string);
  puVar2 = (undefined8 *)&_edata;
  do {
    puVar1 = (undefined8 *)((long)puVar2 - puVar2[-1]);
    *(undefined8 **)puVar2[-2] = puVar1;
    puVar2 = puVar1;
  } while (puVar1 != &dummy_weak_default);
  init_protobuf_defaults_state = 1;
  return (bool)in_AL;
}

Assistant:

static bool InitProtobufDefaultsImpl() {
  if (auto* to_destroy = fixed_address_empty_string.Init()) {
    OnShutdownDestroyString(to_destroy);
  }
  InitWeakDefaults();


  init_protobuf_defaults_state.store(true, std::memory_order_release);
  return true;
}